

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O3

Result * validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetworkClassifier *nn)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Type *a;
  Type *b;
  LogMessage *pLVar4;
  long *plVar5;
  Rep *pRVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  long *plVar7;
  undefined1 *puVar8;
  NeuralNetworkClassifier *pNVar9;
  long lVar10;
  long lVar11;
  undefined1 *b_00;
  char *pcVar12;
  void **ppvVar13;
  int iVar14;
  string trainingInputTarget;
  string err;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string typeString;
  string targetTypeString;
  string target;
  Result r;
  undefined1 local_210 [56];
  string local_1d8;
  int *local_1b8;
  iterator iStack_1b0;
  int *local_1a8;
  Rep *local_1a0;
  NeuralNetworkClassifier *local_198;
  long *local_190 [2];
  long local_180 [2];
  Type *local_170;
  RepeatedPtrFieldBase *local_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 *local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  pointer local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Result local_58;
  
  CoreML::Result::Result(&local_58);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,0x3ba193);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1d8);
    goto LAB_00308d70;
  }
  local_1b8 = (int *)0x0;
  iStack_1b0._M_current = (int *)0x0;
  local_1a8 = (int *)0x0;
  local_210._0_8_ = local_210._0_8_ & 0xffffffff00000000;
  local_168 = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
  iVar14 = 0;
  local_198 = nn;
  do {
    a = google::protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                  (local_168,iVar14);
    if (0 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar14 = 0;
      do {
        b = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar14);
        bVar3 = CoreML::Specification::isEquivalent(a,b);
        if (bVar3) goto LAB_0030845a;
        iVar14 = iVar14 + 1;
      } while (iVar14 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (iStack_1b0._M_current == local_1a8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_1b8,iStack_1b0,(int *)local_210);
    }
    else {
      *iStack_1b0._M_current = local_210._0_4_;
      iStack_1b0._M_current = iStack_1b0._M_current + 1;
    }
LAB_0030845a:
    iVar14 = local_210._0_4_ + LOGLEVEL_WARNING;
    local_210._0_4_ = iVar14;
    iVar1 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  } while (iVar14 < iVar1);
  if ((long)iStack_1b0._M_current - (long)local_1b8 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_1d8,0,(char *)local_1d8._M_string_length,0x3ba202);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1d8);
  }
  else if ((long)iStack_1b0._M_current - (long)local_1b8 >> 2 == (long)iVar1) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_1d8,0,(char *)local_1d8._M_string_length,0x3ba265);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1d8);
  }
  else {
    local_c0 = &local_b0;
    local_b8 = (char *)0x0;
    local_b0 = 0;
    puVar8 = (undefined1 *)local_198->updateparams_;
    if ((NetworkUpdateParameters *)puVar8 == (NetworkUpdateParameters *)0x0) {
      puVar8 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    if ((((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.current_size_
        < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_210,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_210,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_190,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_210);
    }
    iVar14 = *(int *)((long)((((NetworkUpdateParameters *)puVar8)->losslayers_).
                             super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24);
    iVar1 = (((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_;
    if (iVar14 == 10) {
      if (iVar1 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_210,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_210,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_190,pLVar4);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_210);
      }
LAB_003086b1:
      std::__cxx11::string::_M_assign((string *)&local_c0);
    }
    else {
      if (iVar1 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_210,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_210,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_190,pLVar4);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_210);
        iVar14 = *(int *)((long)((((NetworkUpdateParameters *)puVar8)->losslayers_).
                                 super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24);
      }
      if (iVar14 == 0xb) {
        if ((((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_210,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar4 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_210,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_190,pLVar4);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_210);
        }
        goto LAB_003086b1;
      }
    }
    if (iStack_1b0._M_current == local_1b8) {
LAB_00308cda:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     "The training inputs don\'t include the target of the classifier: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(modelDescription->predictedfeaturename_).tagged_ptr_.ptr_ &
                     0xfffffffffffffffe));
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_210);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1d8);
    }
    else {
      pNVar9 = (NeuralNetworkClassifier *)0x0;
      local_1a0 = (Rep *)0x0;
      do {
        local_170 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (local_168,local_1b8[(long)pNVar9]);
        plVar5 = (long *)((ulong)(local_170->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar11 = *plVar5;
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_210,lVar11,plVar5[1] + lVar11);
        pcVar12 = (char *)local_210._8_8_;
        pRVar6 = (Rep *)((ulong)(modelDescription->predictedfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe);
        local_198 = pNVar9;
        if ((void *)local_210._8_8_ == pRVar6->elements[0]) {
          if ((char *)local_210._8_8_ != (char *)0x0) {
            iVar14 = bcmp((void *)local_210._0_8_,*(void **)pRVar6,local_210._8_8_);
            pRVar6 = (Rep *)CONCAT44(extraout_var_00,iVar14);
            if (iVar14 != 0) goto LAB_003087d2;
          }
          pRVar6 = (modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
          ppvVar13 = pRVar6->elements;
          if (pRVar6 == (Rep *)0x0) {
            ppvVar13 = (void **)0x0;
          }
          lVar11 = (long)(modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar11 != 0) {
            local_a0 = (pointer)local_210._0_8_;
            lVar10 = 0;
            do {
              lVar2 = *(long *)((long)ppvVar13 + lVar10);
              pRVar6 = (Rep *)(*(ulong *)(lVar2 + 0x10) & 0xfffffffffffffffe);
              if (pcVar12 == (char *)pRVar6->elements[0]) {
                if (pcVar12 != (char *)0x0) {
                  iVar14 = bcmp(local_a0,*(void **)pRVar6,(size_t)pcVar12);
                  pRVar6 = (Rep *)CONCAT44(extraout_var_01,iVar14);
                  if (iVar14 != 0) goto LAB_003087bb;
                }
                puVar8 = (undefined1 *)local_170->type_;
                if ((FeatureType *)puVar8 == (FeatureType *)0x0) {
                  puVar8 = CoreML::Specification::_FeatureType_default_instance_;
                }
                b_00 = *(undefined1 **)(lVar2 + 0x20);
                if ((FeatureType *)b_00 == (FeatureType *)0x0) {
                  b_00 = CoreML::Specification::_FeatureType_default_instance_;
                }
                bVar3 = CoreML::Specification::operator==((FeatureType *)puVar8,(FeatureType *)b_00)
                ;
                if (!bVar3) {
                  puVar8 = *(undefined1 **)(lVar2 + 0x20);
                  if (puVar8 == (undefined1 *)0x0) {
                    puVar8 = CoreML::Specification::_FeatureType_default_instance_;
                  }
                  pcVar12 = "String";
                  if (*(int *)(puVar8 + 0x24) == 1) {
                    pcVar12 = "Int64";
                  }
                  local_190[0] = local_180;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_190,pcVar12,
                             pcVar12 + (6 - (ulong)(*(int *)(puVar8 + 0x24) == 1)));
                  puVar8 = (undefined1 *)local_170->type_;
                  if ((FeatureType *)puVar8 == (FeatureType *)0x0) {
                    puVar8 = CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar3 = ((FeatureType *)puVar8)->_oneof_case_[0] == 1;
                  pcVar12 = "String";
                  if (bVar3) {
                    pcVar12 = "Int64";
                  }
                  local_e0[0] = local_d0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e0,pcVar12,pcVar12 + (6 - (ulong)bVar3));
                  std::operator+(&local_78,"The type of the training input provided: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_210);
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_f0 = *plVar7;
                    lStack_e8 = plVar5[3];
                    local_100 = &local_f0;
                  }
                  else {
                    local_f0 = *plVar7;
                    local_100 = (long *)*plVar5;
                  }
                  local_f8 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_100,(ulong)local_e0[0]);
                  local_160 = &local_150;
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_150 = *plVar7;
                    lStack_148 = plVar5[3];
                  }
                  else {
                    local_150 = *plVar7;
                    local_160 = (long *)*plVar5;
                  }
                  local_158 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
                  local_140 = &local_130;
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_130 = *plVar7;
                    lStack_128 = plVar5[3];
                  }
                  else {
                    local_130 = *plVar7;
                    local_140 = (long *)*plVar5;
                  }
                  local_138 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_140,(ulong)local_190[0]);
                  local_120 = &local_110;
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_110 = *plVar7;
                    lStack_108 = plVar5[3];
                  }
                  else {
                    local_110 = *plVar7;
                    local_120 = (long *)*plVar5;
                  }
                  local_118 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_88 = *plVar7;
                    lStack_80 = plVar5[3];
                    local_98 = &local_88;
                  }
                  else {
                    local_88 = *plVar7;
                    local_98 = (long *)*plVar5;
                  }
                  local_90 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_98);
                  if (local_98 != &local_88) {
                    operator_delete(local_98,local_88 + 1);
                  }
                  if (local_120 != &local_110) {
                    operator_delete(local_120,local_110 + 1);
                  }
                  if (local_140 != &local_130) {
                    operator_delete(local_140,local_130 + 1);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160,local_150 + 1);
                  }
                  if (local_100 != &local_f0) {
                    operator_delete(local_100,local_f0 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  CoreML::Result::Result
                            (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1d8
                            );
                  if (local_e0[0] != local_d0) {
                    operator_delete(local_e0[0],local_d0[0] + 1);
                  }
                  if (local_190[0] != local_180) {
                    operator_delete(local_190[0],local_180[0] + 1);
                  }
                  bVar3 = false;
                  goto LAB_00308805;
                }
                pRVar6 = (Rep *)CONCAT71(extraout_var,1);
                pcVar12 = (char *)local_210._8_8_;
                local_1a0 = pRVar6;
                break;
              }
LAB_003087bb:
              lVar10 = lVar10 + 8;
            } while (lVar11 * 8 != lVar10);
          }
        }
LAB_003087d2:
        bVar3 = true;
        if (local_b8 == pcVar12) {
          if (pcVar12 != (char *)0x0) {
            iVar14 = bcmp(local_c0,(void *)local_210._0_8_,(size_t)pcVar12);
            pRVar6 = (Rep *)CONCAT44(extraout_var_02,iVar14);
            if (iVar14 != 0) goto LAB_00308805;
          }
          local_1a0 = (Rep *)CONCAT71((int7)((ulong)pRVar6 >> 8),1);
          bVar3 = true;
        }
LAB_00308805:
        if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        if (!bVar3) goto LAB_00308d34;
        pNVar9 = (NeuralNetworkClassifier *)
                 ((long)&(local_198->super_MessageLite)._vptr_MessageLite + 1);
      } while (pNVar9 < (NeuralNetworkClassifier *)
                        ((long)iStack_1b0._M_current - (long)local_1b8 >> 2));
      if (((ulong)local_1a0 & 1) == 0) goto LAB_00308cda;
      CoreML::Result::Result(__return_storage_ptr__);
    }
LAB_00308d34:
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
    }
  }
  if (local_1b8 != (int *)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
LAB_00308d70:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    local_58.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}